

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void autocovar(double *vec,int N,double *acov,int M)

{
  double dVar1;
  int local_48;
  int local_44;
  int t;
  int i;
  double temp2;
  double temp1;
  double m;
  int M_local;
  double *acov_local;
  int N_local;
  double *vec_local;
  
  dVar1 = mean(vec,N);
  if (N < M) {
    m._4_4_ = N + -1;
    printf(
          "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n"
          );
    printf("\n The Output Vector only contains N calculated values.");
  }
  else {
    m._4_4_ = M;
    if (M < 0) {
      m._4_4_ = 0;
    }
  }
  for (local_44 = 0; local_44 < m._4_4_; local_44 = local_44 + 1) {
    acov[local_44] = 0.0;
    for (local_48 = 0; local_48 < N - local_44; local_48 = local_48 + 1) {
      acov[local_44] = (vec[local_48] - dVar1) * (vec[local_48 + local_44] - dVar1) + acov[local_44]
      ;
    }
    acov[local_44] = acov[local_44] / (double)N;
  }
  return;
}

Assistant:

void autocovar(double* vec,int N, double* acov,int M) {
	double m,temp1,temp2;
	int i,t;
	m = mean(vec,N);
	
	if ( M > N) {
		M = N-1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	} else if ( M < 0) {
		M = 0;
	}
	
	for(i = 0; i < M;i++) {
		acov[i] = 0.0;
		for (t = 0; t < N-i;t++) {
			temp1 = vec[t] - m;
			temp2 = vec[t+i] - m;
			acov[i]+= temp1*temp2;
		}
		acov[i] = acov[i] / N;
		
	}
	
	
}